

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * __thiscall QByteArray::insert(QByteArray *this,qsizetype i,qsizetype count,char ch)

{
  DataOps *pDVar1;
  char *pcVar2;
  undefined1 in_CL;
  QArrayDataPointer<char> *in_RDX;
  char **in_RSI;
  QArrayDataPointer<char> *in_RDI;
  QArrayDataPointer<char> *in_stack_ffffffffffffffc0;
  parameter_type t;
  undefined4 in_stack_ffffffffffffffd8;
  undefined3 in_stack_ffffffffffffffdc;
  GrowthPosition where;
  QArrayDataPointer<char> *local_8;
  
  where = CONCAT13(in_CL,in_stack_ffffffffffffffdc);
  local_8 = in_RDI;
  if ((-1 < (long)in_RSI) && (0 < (long)in_RDX)) {
    pDVar1 = QArrayDataPointer<char>::operator->(in_RDI);
    if ((long)in_RSI <
        (pDVar1->super_QCommonArrayOps<char>).super_Type.super_QArrayDataPointer<char>.size) {
      QArrayDataPointer<char>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<char>::insert
                ((QPodArrayOps<char> *)in_RDX,CONCAT44(where,in_stack_ffffffffffffffd8),
                 (qsizetype)in_RDI,(parameter_type)((ulong)in_RSI >> 0x38));
      pcVar2 = QArrayDataPointer<char>::data(in_RDI);
      pcVar2[in_RDI->size] = '\0';
      local_8 = in_RDI;
    }
    else {
      QArrayDataPointer<char>::detachAndGrow
                (in_RDX,where,(qsizetype)in_RDI,in_RSI,in_stack_ffffffffffffffc0);
      pcVar2 = QArrayDataPointer<char>::data(in_RDI);
      if (pcVar2 == (char *)0x0) {
        qBadAlloc();
      }
      pDVar1 = QArrayDataPointer<char>::operator->(in_RDI);
      t = (parameter_type)((ulong)pDVar1 >> 0x38);
      QArrayDataPointer<char>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<char>::copyAppend((QPodArrayOps<char> *)in_RDI,(qsizetype)in_RSI,t);
      QArrayDataPointer<char>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<char>::copyAppend((QPodArrayOps<char> *)in_RDI,(qsizetype)in_RSI,t);
      pcVar2 = QArrayDataPointer<char>::data(in_RDI);
      pcVar2[in_RDI->size] = '\0';
      local_8 = in_RDI;
    }
  }
  return (QByteArray *)local_8;
}

Assistant:

QByteArray &QByteArray::insert(qsizetype i, qsizetype count, char ch)
{
    if (i < 0 || count <= 0)
        return *this;

    if (i >= d->size) {
        // handle this specially, as QArrayDataOps::insert() doesn't handle out of bounds positions
        d.detachAndGrow(Data::GrowsAtEnd, (i - d.size) + count, nullptr, nullptr);
        Q_CHECK_PTR(d.data());
        d->copyAppend(i - d->size, ' ');
        d->copyAppend(count, ch);
        d.data()[d.size] = '\0';
        return *this;
    }

    d->insert(i, count, ch);
    d.data()[d.size] = '\0';
    return *this;
}